

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::benchmarkPreparing(ConsoleReporter *this,StringRef name)

{
  TablePrinter *pTVar1;
  Column *pCVar2;
  unique_ptr<Catch::TablePrinter> *this_00;
  bool bVar3;
  string line;
  const_iterator __begin1;
  Column nameCol;
  string local_d0;
  Column local_b0;
  Column local_78;
  StringRef local_40;
  
  local_40.m_size = name.m_size;
  local_40.m_start = name.m_start;
  lazyPrintWithoutClosingBenchmarkTable(this);
  StringRef::operator_cast_to_string(&local_d0,&local_40);
  TextFlow::Column::Column(&local_b0,&local_d0);
  this_00 = &this->m_tablePrinter;
  pTVar1 = Detail::unique_ptr<Catch::TablePrinter>::operator->(this_00);
  pCVar2 = TextFlow::Column::width
                     (&local_b0,
                      ((pTVar1->m_columnInfos).
                       super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start)->width - 2);
  TextFlow::Column::Column(&local_78,pCVar2);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  TextFlow::Column::const_iterator::const_iterator((const_iterator *)&local_b0,&local_78);
  bVar3 = true;
  while ((local_b0.m_string._M_string_length != local_78.m_string._M_string_length ||
         ((Column *)local_b0.m_string._M_dataplus._M_p != &local_78))) {
    TextFlow::Column::const_iterator::operator*[abi_cxx11_(&local_d0,(const_iterator *)&local_b0);
    if (!bVar3) {
      pTVar1 = Detail::unique_ptr<Catch::TablePrinter>::operator*(this_00);
      Catch::operator<<(pTVar1);
      Catch::operator<<(pTVar1);
      Catch::operator<<(pTVar1);
    }
    pTVar1 = Detail::unique_ptr<Catch::TablePrinter>::operator*(this_00);
    ReusableStringStream::operator<<(&pTVar1->m_oss,&local_d0);
    Catch::operator<<(pTVar1);
    std::__cxx11::string::~string((string *)&local_d0);
    TextFlow::Column::const_iterator::operator++((const_iterator *)&local_b0);
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void ConsoleReporter::benchmarkPreparing( StringRef name ) {
	lazyPrintWithoutClosingBenchmarkTable();

	auto nameCol = TextFlow::Column( static_cast<std::string>( name ) )
                       .width( m_tablePrinter->columnInfos()[0].width - 2 );

	bool firstLine = true;
	for (auto line : nameCol) {
		if (!firstLine)
			(*m_tablePrinter) << ColumnBreak() << ColumnBreak() << ColumnBreak();
		else
			firstLine = false;

		(*m_tablePrinter) << line << ColumnBreak();
	}
}